

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

bool_t prf_model_vertex_palette_optimize(prf_model_t *model)

{
  ushort uVar1;
  uint *puVar2;
  prf_vertex_pool_s **id;
  prf_vertex_pool_s *ppVar3;
  uint uVar4;
  ulong uVar5;
  void *__ptr;
  void *__ptr_00;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  bool_t bVar9;
  uint8_t *__src;
  ulong uVar10;
  uint uVar11;
  uint16_t *uint16ptr;
  uint *puVar12;
  long lVar13;
  prf_cb_t callback;
  prf_cb_t callback_00;
  
  uVar8 = *(uint *)model->vertex_palette->data;
  if (model->vertextras != (prf_vertex_pool_s **)0x0) {
    uVar4 = prf_array_count(model->vertextras);
    uVar6 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar8 = uVar8 + model->vertextras[uVar6]->position;
    }
  }
  __ptr = calloc(1,(ulong)uVar8);
  if (__ptr == (void *)0x0) {
    bVar9 = 0;
    prf_error(9,"memory allocation error (malloc returned NULL)");
  }
  else {
    callback.data = __ptr;
    callback.func = vt_tag_cb;
    prf_model_traverse_io(model,callback);
    __ptr_00 = malloc((ulong)uVar8);
    if (__ptr_00 == (void *)0x0) {
      bVar9 = 0;
      prf_error(9,"memory allocation error (malloc returned NULL)");
      free(__ptr);
    }
    else {
      puVar2 = (uint *)model->vertex_palette->data;
      uVar8 = *puVar2;
      puVar12 = puVar2 + 2;
      uVar5 = 0;
      while( true ) {
        lVar13 = (long)puVar12 - (long)puVar2;
        iVar7 = (int)uVar5;
        if (uVar8 <= (uint)lVar13) break;
        if (*(int *)((long)__ptr + lVar13) == 0) {
          uVar6 = (ulong)*(ushort *)((long)puVar12 + 2);
          uVar5 = (ulong)(iVar7 + (uint)*(ushort *)((long)puVar12 + 2));
        }
        else {
          uVar6 = (ulong)*(ushort *)((long)puVar12 + 2);
          memcpy((void *)((long)__ptr_00 + (lVar13 - uVar5)),puVar12,uVar6);
          *(uint *)((long)__ptr + lVar13) = (uint)lVar13 - iVar7;
        }
        puVar12 = (uint *)((long)puVar12 + uVar6);
      }
      uVar8 = *puVar2;
      if (model->vertextras != (prf_vertex_pool_s **)0x0) {
        uVar4 = prf_array_count(model->vertextras);
        uVar10 = 0;
        uVar6 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar6 = uVar10;
        }
        id = model->vertextras;
        for (; iVar7 = (int)uVar5, uVar10 != uVar6; uVar10 = uVar10 + 1) {
          ppVar3 = id[uVar10];
          for (uVar4 = 0; uVar11 = ppVar3->position, uVar4 < uVar11; uVar4 = uVar4 + uVar1) {
            __src = ppVar3->data + uVar4;
            if (*(int *)((long)__ptr + (ulong)uVar4 + (ulong)uVar8) == 0) {
              uVar1 = *(ushort *)(__src + 2);
              uVar5 = (ulong)((int)uVar5 + (uint)uVar1);
            }
            else {
              uVar11 = uVar8 + uVar4;
              uVar1 = *(ushort *)(__src + 2);
              memcpy((void *)((long)__ptr_00 + (uVar11 - uVar5)),__src,(ulong)uVar1);
              *(uint *)((long)__ptr + (ulong)uVar11) = uVar11 - (int)uVar5;
            }
          }
          uVar8 = uVar11 + uVar8;
        }
        if (id != (prf_vertex_pool_s **)0x0) {
          uVar4 = prf_array_count(id);
          uVar6 = 0;
          uVar5 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar5 = uVar6;
          }
          for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            free(model->vertextras[uVar6]->data);
            free(model->vertextras[uVar6]);
          }
          prf_array_free(model->vertextras);
          model->vertextras = (prf_vertex_pool_s **)0x0;
        }
      }
      uVar8 = uVar8 - iVar7;
      puVar12 = (uint *)model->vertex_palette->data;
      if (model->mempool_id == 0) {
        free(puVar12);
        puVar12 = (uint *)realloc(__ptr_00,(ulong)uVar8);
        model->vertex_palette->data = (uint8_t *)puVar12;
      }
      else {
        if (*puVar12 < uVar8) {
          puVar12 = (uint *)pool_malloc(model->mempool_id,uVar8);
          model->vertex_palette->data = (uint8_t *)puVar12;
        }
        memcpy(puVar12,__ptr_00,(ulong)uVar8);
        free(__ptr_00);
        puVar12 = (uint *)model->vertex_palette->data;
      }
      *puVar12 = uVar8;
      callback_00.data = __ptr;
      callback_00.func = vt_fix_cb;
      prf_model_traverse_io(model,callback_00);
      free(__ptr);
      bVar9 = 1;
    }
  }
  return bVar9;
}

Assistant:

bool_t
prf_model_vertex_palette_optimize(
    prf_model_t * model )
{
    prf_cb_t tag_cb, fix_cb;

    uint32_t length = 0;
    uint8_t * rlt = NULL;

    assert( model != NULL && model->vertex_palette != NULL );

    do { /* create vertex list pool */
        length = ((uint32_t *)(model->vertex_palette->data))[0];
        if ( model->vertextras != NULL ) {
            int i, count;
            count = prf_array_count( model->vertextras );
            for ( i = 0; i < count; i++ )
                length += model->vertextras[i]->position;
        }
        rlt = (uint8_t *)malloc( length );
        if ( rlt == NULL ) {
            prf_error( 9, "memory allocation error (malloc returned NULL)" );
            return FALSE;
        }
        memset( rlt, 0, length );
    } while ( FALSE );

    do { /* traverse and tag vertices */
        prf_cb_func( tag_cb, vt_tag_cb );
        prf_cb_data( tag_cb, rlt );
        prf_model_traverse_io( model, tag_cb );
    } while ( FALSE );

    do { /* compact vertex list and create reverse lookup table */
        uint32_t offset = 0;
        uint32_t datasize = 0;
        uint32_t orig_length = 0;
        uint8_t * ptr = NULL, * origdata = NULL;
        uint8_t * buffer = (uint8_t *)malloc( length );

        if ( buffer == NULL ) {
            prf_error( 9, "memory allocation error (malloc returned NULL)" );
            free( rlt );
            return FALSE;
        }

        origdata = model->vertex_palette->data;
        datasize = ((uint32_t *)(origdata))[0];
       
        /* node for node, check if tagged, and update move offset */
        ptr = origdata + 8;
        while ( ((unsigned int) (ptr - origdata)) < datasize ) {
            uint16_t * uint16ptr = (uint16_t *) ptr;
            if ( ((uint32_t *)(rlt+(ptr-origdata)))[0] != 0 ) {
                /* vertex is in use, move vertex into new buffer */
                memmove( buffer + (ptr-origdata) - offset, ptr, uint16ptr[1] );
                /* set reverse lookup index in rtl table */
                ((uint32_t *)(rlt+(ptr-origdata)))[0] = (ptr-origdata) - offset;
            } else {
                /* vertex not in use => accumulate offset */
                offset += uint16ptr[1]; /* add node length to offset */
            }
            ptr += uint16ptr[1];
        }
        orig_length = ((uint32_t *)(origdata))[0];
        if ( model->vertextras != NULL ) {
            int num, i;
            num = prf_array_count( model->vertextras );
            for ( i = 0; i < num; i++ ) {
                unsigned int pos = 0;
                prf_vertex_pool_t * pool = model->vertextras[i];
                while ( pos < pool->position ) {
                     uint16_t * uint16ptr = (uint16_t *) (pool->data + pos);
                     if ( ((uint32_t *)(rlt + orig_length + pos))[0] != 0 ) {
                         /* vertex in use, move vertex to buffer */
                         memmove( buffer + (orig_length + pos) - offset,
                             uint16ptr, uint16ptr[1] );
                         /* create reverse lookup */
                         ((uint32_t *)(rlt + (orig_length+pos)))[0] =
                                (orig_length+pos) - offset;
                     } else {
                         /* vertex not in use, accumulate offset */
                         offset += uint16ptr[1];
                     }
                     pos += uint16ptr[1];
                }
                orig_length += pool->position;
            }
        }

        /* move buffer back into model with vertextras */
        if ( model->vertextras != NULL ) {
            int i, count = prf_array_count( model->vertextras );
            for ( i = 0; i < count; i++ ) {
                free( model->vertextras[i]->data );
                free( model->vertextras[i] );
            }
            prf_array_free( model->vertextras );
            model->vertextras = NULL;
        }

        if ( model->mempool_id == 0 ) {
            free( model->vertex_palette->data );
            model->vertex_palette->data = 
	      (uint8_t *)realloc( buffer, orig_length-offset );
        } else {
            if ( ((uint32_t *)model->vertex_palette->data)[0] >=
                 (orig_length - offset) ) {
                memcpy( model->vertex_palette->data, buffer,
                    orig_length - offset );
            } else {
                /* some memory is wasted here until memory pool is freed */
	      model->vertex_palette->data = (uint8_t *)
                    pool_malloc( model->mempool_id, orig_length - offset );
                memcpy( model->vertex_palette->data, buffer,
                    orig_length - offset );
            }
            free( buffer );
        }
        ((uint32_t *)model->vertex_palette->data)[0] = orig_length - offset;
    } while ( FALSE );

    do { /* traverse and fix vertex list offsets */
        prf_cb_func( fix_cb, vt_fix_cb );
        prf_cb_data( fix_cb, rlt );
        prf_model_traverse_io( model, fix_cb );
        free( rlt );
    } while ( FALSE );

    return TRUE;
}